

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float ImGui::SliderCalcRatioFromValueT<float,float>
                (ImGuiDataType data_type,float v,float v_min,float v_max,float power,
                float linear_zero_pos)

{
  float fVar1;
  float fVar2;
  
  fVar1 = 0.0;
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    fVar2 = v_max;
    fVar1 = v_min;
    if (v_max <= v_min) {
      fVar2 = v_min;
      fVar1 = v_max;
    }
    if (v <= fVar2) {
      fVar2 = v;
    }
    fVar1 = (float)(~-(uint)(v < fVar1) & (uint)fVar2 | (uint)fVar1 & -(uint)(v < fVar1));
    if (((data_type & 0xfffffffeU) == 8) && ((power != 1.0 || (NAN(power))))) {
      if (0.0 <= fVar1) {
        fVar2 = (float)(~-(uint)(v_min <= 0.0) & (uint)v_min);
        fVar1 = powf((fVar1 - fVar2) / (v_max - fVar2),1.0 / power);
        fVar1 = fVar1 * (1.0 - linear_zero_pos) + linear_zero_pos;
      }
      else {
        fVar2 = 0.0;
        if (v_max <= 0.0) {
          fVar2 = v_max;
        }
        fVar1 = powf(1.0 - (fVar1 - v_min) / (fVar2 - v_min),1.0 / power);
        fVar1 = (1.0 - fVar1) * linear_zero_pos;
      }
    }
    else {
      fVar1 = (fVar1 - v_min) / (v_max - v_min);
    }
  }
  return fVar1;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}